

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_sse4.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_d16_sse4_1
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  uint uVar1;
  char cVar2;
  short sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined2 uVar11;
  short sVar12;
  undefined1 (*pauVar13) [16];
  undefined1 (*pauVar14) [16];
  undefined8 *puVar15;
  int in_ECX;
  long in_RDX;
  char in_SIL;
  long in_RDI;
  long in_R8;
  int in_R9D;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  __m128i diff_round;
  __m128i diff;
  __m128i diffb;
  __m128i diffa;
  __m128i data_src1;
  __m128i data_src0;
  int j;
  int i;
  __m128i add_sign;
  __m128i add_const;
  __m128i clip_diff;
  __m128i mask_base_16;
  __m128i round_const;
  int round;
  int mask_base;
  int which_inverse;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined1 local_2a0;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_190;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 local_158;
  undefined2 uStack_156;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined2 local_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_c2;
  undefined2 uStack_ba;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  __m128i *dst;
  __m128i res_8;
  __m128i diff_const_16;
  __m128i diff_sign;
  __m128i diff_clamp;
  __m128i diff_mask;
  __m128i diff_factor;
  char cVar3;
  char cVar4;
  char cVar5;
  
  bVar16 = in_SIL != '\0';
  uVar1 = ((int)diffb[0] + 6) - (*(int *)(diff[1] + 0x14) + *(int *)(diff[1] + 0x18));
  local_2a0 = (byte)uVar1;
  uVar11 = (undefined2)((uint)(1 << (local_2a0 & 0x1f)) >> 1);
  auVar7._2_2_ = uVar11;
  auVar7._0_2_ = uVar11;
  auVar7._4_2_ = uVar11;
  auVar7._6_2_ = uVar11;
  auVar7._10_2_ = uVar11;
  auVar7._8_2_ = uVar11;
  auVar7._12_2_ = uVar11;
  auVar7._14_2_ = uVar11;
  sVar12 = (ushort)bVar16 * 0x40;
  sVar6 = -(ushort)bVar16;
  for (local_2fc = 0; local_2fc < (int)diff_round[1]; local_2fc = local_2fc + 1) {
    for (local_300 = 0; local_300 < (int)diff[0]; local_300 = local_300 + 8) {
      pauVar13 = (undefined1 (*) [16])(in_RDX + (long)(local_2fc * in_ECX + local_300) * 2);
      pauVar14 = (undefined1 (*) [16])(in_R8 + (long)(local_2fc * in_R9D + local_300) * 2);
      auVar17 = psubusw(*pauVar13,*pauVar14);
      auVar18 = psubusw(*pauVar14,*pauVar13);
      local_198 = auVar17._0_2_;
      uStack_196 = auVar17._2_2_;
      uStack_194 = auVar17._4_2_;
      uStack_192 = auVar17._6_2_;
      uStack_190 = auVar17._8_2_;
      uStack_18e = auVar17._10_2_;
      uStack_18c = auVar17._12_2_;
      uStack_18a = auVar17._14_2_;
      local_1a8 = auVar18._0_2_;
      uStack_1a6 = auVar18._2_2_;
      uStack_1a4 = auVar18._4_2_;
      uStack_1a2 = auVar18._6_2_;
      uStack_1a0 = auVar18._8_2_;
      uStack_19e = auVar18._10_2_;
      uStack_19c = auVar18._12_2_;
      uStack_19a = auVar18._14_2_;
      auVar17._2_2_ =
           (uStack_196 < uStack_1a6) * uStack_1a6 | (uStack_196 >= uStack_1a6) * uStack_196;
      auVar17._0_2_ = (local_198 < local_1a8) * local_1a8 | (local_198 >= local_1a8) * local_198;
      auVar17._4_2_ =
           (uStack_194 < uStack_1a4) * uStack_1a4 | (uStack_194 >= uStack_1a4) * uStack_194;
      auVar17._6_2_ =
           (uStack_192 < uStack_1a2) * uStack_1a2 | (uStack_192 >= uStack_1a2) * uStack_192;
      auVar17._10_2_ =
           (uStack_18e < uStack_19e) * uStack_19e | (uStack_18e >= uStack_19e) * uStack_18e;
      auVar17._8_2_ =
           (uStack_190 < uStack_1a0) * uStack_1a0 | (uStack_190 >= uStack_1a0) * uStack_190;
      auVar17._12_2_ =
           (uStack_18c < uStack_19c) * uStack_19c | (uStack_18c >= uStack_19c) * uStack_18c;
      auVar17._14_2_ =
           (uStack_18a < uStack_19a) * uStack_19a | (uStack_18a >= uStack_19a) * uStack_18a;
      auVar17 = paddusw(auVar17,auVar7);
      local_158 = auVar17._0_2_;
      uStack_156 = auVar17._2_2_;
      uStack_154 = auVar17._4_2_;
      uStack_152 = auVar17._6_2_;
      uStack_150 = auVar17._8_2_;
      uStack_14e = auVar17._10_2_;
      uStack_14c = auVar17._12_2_;
      uStack_14a = auVar17._14_2_;
      uVar19 = (ulong)uVar1;
      auVar8._2_2_ = (uStack_156 >> uVar19) >> 4;
      auVar8._0_2_ = (local_158 >> uVar19) >> 4;
      auVar8._4_2_ = (uStack_154 >> uVar19) >> 4;
      auVar8._6_2_ = (uStack_152 >> uVar19) >> 4;
      auVar8._10_2_ = (uStack_14e >> uVar19) >> 4;
      auVar8._8_2_ = (uStack_150 >> uVar19) >> 4;
      auVar8._12_2_ = (uStack_14c >> uVar19) >> 4;
      auVar8._14_2_ = (uStack_14a >> uVar19) >> 4;
      auVar18._8_8_ = 0x26002600260026;
      auVar18._0_8_ = 0x26002600260026;
      auVar17 = paddsw(auVar8,auVar18);
      local_f8 = auVar17._0_2_;
      uStack_f6 = auVar17._2_2_;
      uStack_f4 = auVar17._4_2_;
      uStack_f2 = auVar17._6_2_;
      uStack_f0 = auVar17._8_2_;
      uStack_ee = auVar17._10_2_;
      uStack_ec = auVar17._12_2_;
      uStack_ea = auVar17._14_2_;
      auVar10._2_2_ = (ushort)(0x40 < uStack_f6) * 0x40 | (ushort)(0x40 >= uStack_f6) * uStack_f6;
      auVar10._0_2_ = (ushort)(0x40 < local_f8) * 0x40 | (ushort)(0x40 >= local_f8) * local_f8;
      auVar10._4_2_ = (ushort)(0x40 < uStack_f4) * 0x40 | (ushort)(0x40 >= uStack_f4) * uStack_f4;
      auVar10._6_2_ = (ushort)(0x40 < uStack_f2) * 0x40 | (ushort)(0x40 >= uStack_f2) * uStack_f2;
      auVar10._10_2_ = (ushort)(0x40 < uStack_ee) * 0x40 | (ushort)(0x40 >= uStack_ee) * uStack_ee;
      auVar10._8_2_ = (ushort)(0x40 < uStack_f0) * 0x40 | (ushort)(0x40 >= uStack_f0) * uStack_f0;
      auVar10._12_2_ = (ushort)(0x40 < uStack_ec) * 0x40 | (ushort)(0x40 >= uStack_ec) * uStack_ec;
      auVar10._14_2_ = (ushort)(0x40 < uStack_ea) * 0x40 | (ushort)(0x40 >= uStack_ea) * uStack_ea;
      auVar9._8_8_ = CONCAT26(sVar6,CONCAT24(sVar6,CONCAT22(sVar6,sVar6))) | 0x1000100010001;
      auVar9._0_8_ = CONCAT26(sVar6,CONCAT24(sVar6,CONCAT22(sVar6,sVar6))) | 0x1000100010001;
      auVar17 = psignw(auVar10,auVar9);
      local_b8 = auVar17._0_2_;
      uStack_b6 = auVar17._2_2_;
      uStack_b4 = auVar17._4_2_;
      uStack_b2 = auVar17._6_2_;
      uStack_b0 = auVar17._8_2_;
      uStack_ae = auVar17._10_2_;
      uStack_ac = auVar17._12_2_;
      uStack_aa = auVar17._14_2_;
      uStack_c2 = (short)(((ulong)bVar16 << 0x36) >> 0x30);
      uStack_ba = (short)(((ulong)bVar16 << 0x36) >> 0x30);
      local_b8 = local_b8 + sVar12;
      uStack_b6 = uStack_b6 + sVar12;
      uStack_b4 = uStack_b4 + sVar12;
      uStack_b2 = uStack_b2 + uStack_c2;
      uStack_b0 = uStack_b0 + sVar12;
      uStack_ae = uStack_ae + sVar12;
      uStack_ac = uStack_ac + sVar12;
      uStack_aa = uStack_aa + uStack_ba;
      cVar2 = (0 < local_b8) * (local_b8 < 0x100) * (char)local_b8 - (0xff < local_b8);
      cVar3 = (0 < uStack_b6) * (uStack_b6 < 0x100) * (char)uStack_b6 - (0xff < uStack_b6);
      cVar4 = (0 < uStack_b4) * (uStack_b4 < 0x100) * (char)uStack_b4 - (0xff < uStack_b4);
      cVar5 = (0 < uStack_b2) * (uStack_b2 < 0x100) * (char)uStack_b2 - (0xff < uStack_b2);
      puVar15 = (undefined8 *)(in_RDI + (local_2fc * (int)diff[0] + local_300));
      if ((int)diff[0] - local_300 < 5) {
        *(uint *)puVar15 = CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,cVar2)));
      }
      else {
        *puVar15 = CONCAT17((0 < uStack_aa) * (uStack_aa < 0x100) * (char)uStack_aa -
                            (0xff < uStack_aa),
                            CONCAT16((0 < uStack_ac) * (uStack_ac < 0x100) * (char)uStack_ac -
                                     (0xff < uStack_ac),
                                     CONCAT15((0 < uStack_ae) * (uStack_ae < 0x100) *
                                              (char)uStack_ae - (0xff < uStack_ae),
                                              CONCAT14((0 < uStack_b0) * (uStack_b0 < 0x100) *
                                                       (char)uStack_b0 - (0xff < uStack_b0),
                                                       CONCAT13(cVar5,CONCAT12(cVar4,CONCAT11(cVar3,
                                                  cVar2)))))));
      }
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_sse4_1(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  const int which_inverse = (mask_type == DIFFWTD_38) ? 0 : 1;
  const int mask_base = 38;
  int round =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1 + (bd - 8);
  const __m128i round_const = _mm_set1_epi16((1 << round) >> 1);
  const __m128i mask_base_16 = _mm_set1_epi16(mask_base);
  const __m128i clip_diff = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i add_const =
      _mm_set1_epi16((which_inverse ? AOM_BLEND_A64_MAX_ALPHA : 0));
  const __m128i add_sign = _mm_set1_epi16((which_inverse ? -1 : 1));

  int i, j;
  // When rounding constant is added, there is a possibility of overflow.
  // However that much precision is not required. Code should very well work for
  // other values of DIFF_FACTOR_LOG2 and AOM_BLEND_A64_MAX_ALPHA as well. But
  // there is a possibility of corner case bugs.
  assert(DIFF_FACTOR_LOG2 == 4);
  assert(AOM_BLEND_A64_MAX_ALPHA == 64);
  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; j += 8) {
      const __m128i data_src0 =
          _mm_loadu_si128((__m128i *)&src0[(i * src0_stride) + j]);
      const __m128i data_src1 =
          _mm_loadu_si128((__m128i *)&src1[(i * src1_stride) + j]);

      const __m128i diffa = _mm_subs_epu16(data_src0, data_src1);
      const __m128i diffb = _mm_subs_epu16(data_src1, data_src0);
      const __m128i diff = _mm_max_epu16(diffa, diffb);
      const __m128i diff_round =
          _mm_srli_epi16(_mm_adds_epu16(diff, round_const), round);
      const __m128i diff_factor = _mm_srli_epi16(diff_round, DIFF_FACTOR_LOG2);
      const __m128i diff_mask = _mm_adds_epi16(diff_factor, mask_base_16);
      __m128i diff_clamp = _mm_min_epi16(diff_mask, clip_diff);
      // clamp to 0 can be skipped since we are using add and saturate
      // instruction

      const __m128i diff_sign = _mm_sign_epi16(diff_clamp, add_sign);
      const __m128i diff_const_16 = _mm_add_epi16(diff_sign, add_const);

      // 8 bit conversion and saturation to uint8
      const __m128i res_8 = _mm_packus_epi16(diff_const_16, diff_const_16);

      // Store values into the destination buffer
      __m128i *const dst = (__m128i *)&mask[i * w + j];

      if ((w - j) > 4) {
        _mm_storel_epi64(dst, res_8);
      } else {  // w==4
        *(int *)dst = _mm_cvtsi128_si32(res_8);
      }
    }
  }
}